

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

XmlRpcValue __thiscall miniros::Subscription::getStats(Subscription *this)

{
  bool bVar1;
  element_type *peVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value aVar3;
  XmlRpcValue *in_RDI;
  XmlRpcValue XVar4;
  Stats *s;
  iterator c;
  uint32_t cidx;
  scoped_lock<std::mutex> lock;
  XmlRpcValue conn_data;
  XmlRpcValue *stats;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  XmlRpcValue *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff08;
  XmlRpcValue *in_stack_ffffffffffffff10;
  XmlRpcValue *in_stack_ffffffffffffff18;
  XmlRpcValue *in_stack_ffffffffffffff20;
  XmlRpcValue *in_stack_ffffffffffffff28;
  XmlRpcValue *in_stack_ffffffffffffff30;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_60;
  undefined4 local_54;
  XmlRpcValue local_48 [3];
  byte local_11;
  
  local_11 = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(in_RDI);
  XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cf933);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_48);
  XmlRpc::XmlRpcValue::setSize(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_54 = 0;
  local_60._M_current =
       (shared_ptr<miniros::PublisherLink> *)
       std::
       vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
       ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while( true ) {
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
           *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(&local_60);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cf9e7);
    PublisherLink::getStats(peVar2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(&local_60);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cfa18);
    PublisherLink::getConnectionID(peVar2);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    in_stack_ffffffffffffff28 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    in_stack_ffffffffffffff18 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator++(&local_60);
  }
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_11 = 1;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4cfc92);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cfc9f);
  aVar3 = extraout_RDX;
  if ((local_11 & 1) == 0) {
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cfcc4);
    aVar3 = extraout_RDX_00;
  }
  XVar4._value.asDouble = aVar3.asDouble;
  XVar4._0_8_ = in_RDI;
  return XVar4;
}

Assistant:

XmlRpcValue Subscription::getStats()
{
  XmlRpcValue stats;
  stats[0] = name_;
  XmlRpcValue conn_data;
  conn_data.setSize(0);

  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  uint32_t cidx = 0;
  for (V_PublisherLink::iterator c = publisher_links_.begin();
       c != publisher_links_.end(); ++c)
  {
    const PublisherLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    conn_data[cidx][1] = (int)s.bytes_received_;
    conn_data[cidx][2] = (int)s.messages_received_;
    conn_data[cidx][3] = (int)s.drops_;
    conn_data[cidx][4] = 0; // figure out something for this. not sure.
  }

  stats[1] = conn_data;
  return stats;
}